

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_ResizeHysteresis_Test<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_ResizeHysteresis_Test<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  key_type kVar2;
  key_type line;
  key_type kVar3;
  Message *message;
  AssertHelper *this_00;
  size_type sVar4;
  value_type file;
  value_type this_01;
  AssertHelper *this_02;
  long in_RDI;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  TypeParam ht;
  AssertionResult gtest_ar;
  size_type old_bucket_count;
  HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffc48;
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffc50;
  undefined4 in_stack_fffffffffffffc58;
  int in_stack_fffffffffffffc5c;
  HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc68;
  int in_stack_fffffffffffffc6c;
  HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffffc70;
  undefined8 in_stack_fffffffffffffc78;
  Type TVar5;
  undefined4 in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc84;
  AssertionResult local_2f8;
  key_type local_2e4;
  value_type local_284;
  key_type local_27c;
  value_type *in_stack_fffffffffffffd88;
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffd90;
  AssertionResult local_1f0;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_1e0;
  Hasher local_1d0;
  Hasher local_1c4 [16];
  size_type local_100;
  AssertionResult local_f8;
  key_type local_e4;
  value_type local_84;
  key_type local_7c;
  value_type local_20;
  size_type local_18;
  key_type local_c;
  
  TVar5 = (Type)((ulong)in_stack_fffffffffffffc78 >> 0x20);
  local_c = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key(in_stack_fffffffffffffc50,(key_type *)in_stack_fffffffffffffc48);
  local_18 = google::
             BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::bucket_count((BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0xff077f);
  message = (Message *)(in_RDI + 0x10);
  local_20 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(in_stack_fffffffffffffc48,0);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  this_00 = (AssertHelper *)(in_RDI + 0x10);
  local_7c = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase(in_stack_fffffffffffffc50,(key_type *)in_stack_fffffffffffffc48);
  local_84 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(in_stack_fffffffffffffc48,0);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  local_e4 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase(in_stack_fffffffffffffc50,(key_type *)in_stack_fffffffffffffc48);
  local_100 = google::
              BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xff089e);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
             (char *)in_stack_fffffffffffffc60,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
             (unsigned_long *)in_stack_fffffffffffffc50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f8);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
    testing::AssertionResult::failure_message((AssertionResult *)0xff0905);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),TVar5,
               (char *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
               (char *)in_stack_fffffffffffffc60);
    testing::internal::AssertHelper::operator=(this_00,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc50);
    testing::Message::~Message((Message *)0xff0962);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xff09d3);
  Hasher::Hasher(local_1c4,0);
  Hasher::Hasher(&local_1d0,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_1e0,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashMap
            (in_stack_fffffffffffffc70,CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68)
             ,(hasher *)in_stack_fffffffffffffc60,
             (key_equal *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
             (allocator_type *)in_stack_fffffffffffffc50);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_1e0);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::bucket_count((BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  *)0xff0a56);
  testing::internal::CmpHelperLT<unsigned_long,unsigned_int>
            ((char *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
             (char *)in_stack_fffffffffffffc60,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
             (uint *)in_stack_fffffffffffffc50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1f0);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
    testing::AssertionResult::failure_message((AssertionResult *)0xff0b27);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),TVar5,
               (char *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
               (char *)in_stack_fffffffffffffc60);
    testing::internal::AssertHelper::operator=(this_00,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc50);
    testing::Message::~Message((Message *)0xff0b84);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xff0bf5);
  kVar2 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueKey(in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key(in_stack_fffffffffffffc50,(key_type *)in_stack_fffffffffffffc48);
  sVar4 = google::
          BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::bucket_count((BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                          *)0xff0c3c);
  local_18 = sVar4;
  file = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueObject(in_stack_fffffffffffffc48,0);
  TVar5 = (Type)(sVar4 >> 0x20);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  line = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueKey(in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
  local_27c = line;
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase(in_stack_fffffffffffffc50,(key_type *)in_stack_fffffffffffffc48);
  this_01 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueObject(in_stack_fffffffffffffc48,0);
  local_284 = this_01;
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  kVar3 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueKey((HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)this_01,in_stack_fffffffffffffc5c);
  local_2e4 = kVar3;
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase(in_stack_fffffffffffffc50,(key_type *)in_stack_fffffffffffffc48);
  this_02 = (AssertHelper *)
            google::
            BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::bucket_count((BaseHashtableInterface<google::sparse_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)0xff0d5b);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((char *)CONCAT44(line,in_stack_fffffffffffffc68),(char *)this_01,
             (unsigned_long *)CONCAT44(kVar3,in_stack_fffffffffffffc58),(unsigned_long *)this_02);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2f8);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(kVar2,in_stack_fffffffffffffc80));
    testing::AssertionResult::failure_message((AssertionResult *)0xff0de2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(kVar2,in_stack_fffffffffffffc80),TVar5,(char *)file,line,
               (char *)this_01);
    testing::internal::AssertHelper::operator=(this_00,message);
    testing::internal::AssertHelper::~AssertHelper(this_02);
    testing::Message::~Message((Message *)0xff0e3d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xff0ea8);
  google::
  HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xff0eb5);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ResizeHysteresis) {
  // We want to make sure that when we create a hashtable, and then
  // add and delete one element, the size of the hashtable doesn't
  // change.
  this->ht_.set_deleted_key(this->UniqueKey(1));
  typename TypeParam::size_type old_bucket_count = this->ht_.bucket_count();
  this->ht_.insert(this->UniqueObject(4));
  this->ht_.erase(this->UniqueKey(4));
  this->ht_.insert(this->UniqueObject(4));
  this->ht_.erase(this->UniqueKey(4));
  EXPECT_EQ(old_bucket_count, this->ht_.bucket_count());

  // Try it again, but with a hashtable that starts very small
  TypeParam ht(2);
  EXPECT_LT(ht.bucket_count(), 32u);  // verify we really do start small
  ht.set_deleted_key(this->UniqueKey(1));
  old_bucket_count = ht.bucket_count();
  ht.insert(this->UniqueObject(4));
  ht.erase(this->UniqueKey(4));
  ht.insert(this->UniqueObject(4));
  ht.erase(this->UniqueKey(4));
  EXPECT_EQ(old_bucket_count, ht.bucket_count());
}